

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sws.c
# Opt level: O0

void nn_sws_start(nn_sws *self,nn_usock *usock,int mode,char *resource,char *host,uint8_t msg_type)

{
  undefined8 in_RCX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined8 in_R8;
  undefined1 in_R9B;
  nn_fsm_owner *in_stack_ffffffffffffffc8;
  undefined6 in_stack_ffffffffffffffd0;
  bool bVar1;
  
  bVar1 = false;
  if (*(long *)(in_RDI + 0x68) == 0) {
    bVar1 = *(long *)(in_RDI + 0x1530) == 0;
  }
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
            "self->usock == NULL && self->usock_owner.fsm == NULL",
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ws/sws.c"
            ,0xba);
    fflush(_stderr);
    nn_err_abort();
  }
  *(undefined4 *)(in_RDI + 0x1528) = 1;
  *(long *)(in_RDI + 0x1530) = in_RDI;
  nn_usock_swap_owner((nn_usock *)CONCAT17(in_R9B,CONCAT16(bVar1,in_stack_ffffffffffffffd0)),
                      in_stack_ffffffffffffffc8);
  *(undefined8 *)(in_RDI + 0x68) = in_RSI;
  *(undefined4 *)(in_RDI + 0x60) = in_EDX;
  *(undefined8 *)(in_RDI + 0x1610) = in_RCX;
  *(undefined8 *)(in_RDI + 0x1618) = in_R8;
  *(undefined1 *)(in_RDI + 0x5c) = in_R9B;
  nn_fsm_start((nn_fsm *)0x14912b);
  return;
}

Assistant:

void nn_sws_start (struct nn_sws *self, struct nn_usock *usock, int mode,
    const char *resource, const char *host, uint8_t msg_type)
{
    /*  Take ownership of the underlying socket. */
    nn_assert (self->usock == NULL && self->usock_owner.fsm == NULL);
    self->usock_owner.src = NN_SWS_SRC_USOCK;
    self->usock_owner.fsm = &self->fsm;
    nn_usock_swap_owner (usock, &self->usock_owner);
    self->usock = usock;
    self->mode = mode;
    self->resource = resource;
    self->remote_host = host;

    self->msg_type = msg_type;

    /*  Launch the state machine. */
    nn_fsm_start (&self->fsm);
}